

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000009beb20 = 0x2d2d2d2d2d2d2d;
    uRam00000000009beb27._0_1_ = '-';
    uRam00000000009beb27._1_1_ = '-';
    uRam00000000009beb27._2_1_ = '-';
    uRam00000000009beb27._3_1_ = '-';
    uRam00000000009beb27._4_1_ = '-';
    uRam00000000009beb27._5_1_ = '-';
    uRam00000000009beb27._6_1_ = '-';
    uRam00000000009beb27._7_1_ = '-';
    DAT_009beb10 = '-';
    DAT_009beb10_1._0_1_ = '-';
    DAT_009beb10_1._1_1_ = '-';
    DAT_009beb10_1._2_1_ = '-';
    DAT_009beb10_1._3_1_ = '-';
    DAT_009beb10_1._4_1_ = '-';
    DAT_009beb10_1._5_1_ = '-';
    DAT_009beb10_1._6_1_ = '-';
    uRam00000000009beb18 = 0x2d2d2d2d2d2d2d;
    DAT_009beb1f = 0x2d;
    DAT_009beb00 = '-';
    DAT_009beb00_1._0_1_ = '-';
    DAT_009beb00_1._1_1_ = '-';
    DAT_009beb00_1._2_1_ = '-';
    DAT_009beb00_1._3_1_ = '-';
    DAT_009beb00_1._4_1_ = '-';
    DAT_009beb00_1._5_1_ = '-';
    DAT_009beb00_1._6_1_ = '-';
    uRam00000000009beb08._0_1_ = '-';
    uRam00000000009beb08._1_1_ = '-';
    uRam00000000009beb08._2_1_ = '-';
    uRam00000000009beb08._3_1_ = '-';
    uRam00000000009beb08._4_1_ = '-';
    uRam00000000009beb08._5_1_ = '-';
    uRam00000000009beb08._6_1_ = '-';
    uRam00000000009beb08._7_1_ = '-';
    DAT_009beaf0 = '-';
    DAT_009beaf0_1._0_1_ = '-';
    DAT_009beaf0_1._1_1_ = '-';
    DAT_009beaf0_1._2_1_ = '-';
    DAT_009beaf0_1._3_1_ = '-';
    DAT_009beaf0_1._4_1_ = '-';
    DAT_009beaf0_1._5_1_ = '-';
    DAT_009beaf0_1._6_1_ = '-';
    uRam00000000009beaf8._0_1_ = '-';
    uRam00000000009beaf8._1_1_ = '-';
    uRam00000000009beaf8._2_1_ = '-';
    uRam00000000009beaf8._3_1_ = '-';
    uRam00000000009beaf8._4_1_ = '-';
    uRam00000000009beaf8._5_1_ = '-';
    uRam00000000009beaf8._6_1_ = '-';
    uRam00000000009beaf8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000009beae8._0_1_ = '-';
    uRam00000000009beae8._1_1_ = '-';
    uRam00000000009beae8._2_1_ = '-';
    uRam00000000009beae8._3_1_ = '-';
    uRam00000000009beae8._4_1_ = '-';
    uRam00000000009beae8._5_1_ = '-';
    uRam00000000009beae8._6_1_ = '-';
    uRam00000000009beae8._7_1_ = '-';
    DAT_009beb2f = 0;
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar2,'\n');
  colourGuard.m_moved = false;
  Colour::use(FileName);
  poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(poVar2,&lineInfo);
  std::operator<<(poVar2,'\n');
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000009bebc0 = 0x2e2e2e2e2e2e2e;
    uRam00000000009bebc7._0_1_ = '.';
    uRam00000000009bebc7._1_1_ = '.';
    uRam00000000009bebc7._2_1_ = '.';
    uRam00000000009bebc7._3_1_ = '.';
    uRam00000000009bebc7._4_1_ = '.';
    uRam00000000009bebc7._5_1_ = '.';
    uRam00000000009bebc7._6_1_ = '.';
    uRam00000000009bebc7._7_1_ = '.';
    DAT_009bebb0 = '.';
    DAT_009bebb0_1._0_1_ = '.';
    DAT_009bebb0_1._1_1_ = '.';
    DAT_009bebb0_1._2_1_ = '.';
    DAT_009bebb0_1._3_1_ = '.';
    DAT_009bebb0_1._4_1_ = '.';
    DAT_009bebb0_1._5_1_ = '.';
    DAT_009bebb0_1._6_1_ = '.';
    uRam00000000009bebb8 = 0x2e2e2e2e2e2e2e;
    DAT_009bebbf = 0x2e;
    DAT_009beba0 = '.';
    DAT_009beba0_1._0_1_ = '.';
    DAT_009beba0_1._1_1_ = '.';
    DAT_009beba0_1._2_1_ = '.';
    DAT_009beba0_1._3_1_ = '.';
    DAT_009beba0_1._4_1_ = '.';
    DAT_009beba0_1._5_1_ = '.';
    DAT_009beba0_1._6_1_ = '.';
    uRam00000000009beba8._0_1_ = '.';
    uRam00000000009beba8._1_1_ = '.';
    uRam00000000009beba8._2_1_ = '.';
    uRam00000000009beba8._3_1_ = '.';
    uRam00000000009beba8._4_1_ = '.';
    uRam00000000009beba8._5_1_ = '.';
    uRam00000000009beba8._6_1_ = '.';
    uRam00000000009beba8._7_1_ = '.';
    DAT_009beb90 = '.';
    DAT_009beb90_1._0_1_ = '.';
    DAT_009beb90_1._1_1_ = '.';
    DAT_009beb90_1._2_1_ = '.';
    DAT_009beb90_1._3_1_ = '.';
    DAT_009beb90_1._4_1_ = '.';
    DAT_009beb90_1._5_1_ = '.';
    DAT_009beb90_1._6_1_ = '.';
    uRam00000000009beb98._0_1_ = '.';
    uRam00000000009beb98._1_1_ = '.';
    uRam00000000009beb98._2_1_ = '.';
    uRam00000000009beb98._3_1_ = '.';
    uRam00000000009beb98._4_1_ = '.';
    uRam00000000009beb98._5_1_ = '.';
    uRam00000000009beb98._6_1_ = '.';
    uRam00000000009beb98._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000009beb88._0_1_ = '.';
    uRam00000000009beb88._1_1_ = '.';
    uRam00000000009beb88._2_1_ = '.';
    uRam00000000009beb88._3_1_ = '.';
    uRam00000000009beb88._4_1_ = '.';
    uRam00000000009beb88._5_1_ = '.';
    uRam00000000009beb88._6_1_ = '.';
    uRam00000000009beb88._7_1_ = '.';
    DAT_009bebcf = 0;
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::operator<<(poVar2,'\n');
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString((*it).name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << '\n';
}